

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsLongStressCase.cpp
# Opt level: O0

void __thiscall
deqp::gls::LongStressCaseInternal::DebugInfoRenderer::~DebugInfoRenderer(DebugInfoRenderer *this)

{
  ShaderProgram *this_00;
  DebugInfoRenderer *this_local;
  
  this_00 = this->m_prog;
  if (this_00 != (ShaderProgram *)0x0) {
    glu::ShaderProgram::~ShaderProgram(this_00);
    operator_delete(this_00,0xd0);
  }
  std::vector<unsigned_short,_std::allocator<unsigned_short>_>::~vector(&this->m_ndxBuf);
  std::vector<float,_std::allocator<float>_>::~vector(&this->m_posBuf);
  return;
}

Assistant:

~DebugInfoRenderer		(void) { delete m_prog; }